

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O2

optional<_khr_df_primaries_e> __thiscall
ktx::OptionsCreate::parseColorPrimaries
          (OptionsCreate *this,ParseResult *args,char *argName,Reporter *report)

{
  size_t sVar1;
  char *__s;
  int iVar2;
  OptionValue *pOVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long lVar5;
  const_iterator cVar6;
  ulong uVar7;
  ulong uVar8;
  _Optional_payload_base<_khr_df_primaries_e> _Var9;
  string prefixStr;
  string primariesStr;
  undefined1 local_2bf;
  undefined1 local_2be;
  undefined1 local_2bd;
  _khr_df_primaries_e local_2bc;
  char *local_2b8;
  string local_2b0;
  _khr_df_primaries_e local_290 [10];
  string local_268;
  string local_248;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  local_228;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  local_200;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  local_1d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  local_188;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  local_160;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  local_138;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  local_110;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  local_e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  local_c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  local_98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  local_70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  local_48;
  
  local_2b8 = argName;
  if (parseColorPrimaries(cxxopts::ParseResult&,char_const*,ktx::Reporter&)::values_abi_cxx11_ ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&parseColorPrimaries(cxxopts::ParseResult&,char_const*,ktx::Reporter&)
                                 ::values_abi_cxx11_);
    if (iVar2 != 0) {
      local_2b0._M_dataplus._M_p._0_4_ = 0;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
      ::pair<const_char_(&)[5],__khr_df_primaries_e,_true>
                (&local_228,(char (*) [5])0x1e2481,(_khr_df_primaries_e *)&local_2b0);
      local_268._M_dataplus._M_p._0_4_ = 1;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
      ::pair<const_char_(&)[6],__khr_df_primaries_e,_true>
                (&local_200,(char (*) [6])"BT709",(_khr_df_primaries_e *)&local_268);
      local_2bc = KHR_DF_PRIMARIES_BT709;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
      ::pair<const_char_(&)[5],__khr_df_primaries_e,_true>
                (&local_1d8,(char (*) [5])"SRGB",&local_2bc);
      local_290[9] = 2;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
      ::pair<const_char_(&)[10],__khr_df_primaries_e,_true>
                (&local_1b0,(char (*) [10])"BT601_EBU",local_290 + 9);
      local_290[8] = 3;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
      ::pair<const_char_(&)[12],__khr_df_primaries_e,_true>
                (&local_188,(char (*) [12])"BT601_SMPTE",local_290 + 8);
      local_290[7] = 4;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
      ::pair<const_char_(&)[7],__khr_df_primaries_e,_true>
                (&local_160,(char (*) [7])"BT2020",local_290 + 7);
      local_290[6] = 5;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
      ::pair<const_char_(&)[7],__khr_df_primaries_e,_true>
                (&local_138,(char (*) [7])"CIEXYZ",local_290 + 6);
      local_290[5] = 6;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
      ::pair<const_char_(&)[5],__khr_df_primaries_e,_true>
                (&local_110,(char (*) [5])"ACES",local_290 + 5);
      local_290[4] = 7;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
      ::pair<const_char_(&)[7],__khr_df_primaries_e,_true>
                (&local_e8,(char (*) [7])"ACESCC",local_290 + 4);
      local_290[3] = 8;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
      ::pair<const_char_(&)[9],__khr_df_primaries_e,_true>
                (&local_c0,(char (*) [9])"NTSC1953",local_290 + 3);
      local_290[2] = 9;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
      ::pair<const_char_(&)[7],__khr_df_primaries_e,_true>
                (&local_98,(char (*) [7])"PAL525",local_290 + 2);
      local_290[1] = 10;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
      ::pair<const_char_(&)[10],__khr_df_primaries_e,_true>
                (&local_70,(char (*) [10])"DISPLAYP3",local_290 + 1);
      local_290[0] = KHR_DF_PRIMARIES_ADOBERGB;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
      ::pair<const_char_(&)[9],__khr_df_primaries_e,_true>
                (&local_48,(char (*) [9])"ADOBERGB",local_290);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,_khr_df_primaries_e>,std::allocator<std::pair<std::__cxx11::string_const,_khr_df_primaries_e>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_Hashtable<std::pair<std::__cxx11::string_const,_khr_df_primaries_e>const*>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,_khr_df_primaries_e>,std::allocator<std::pair<std::__cxx11::string_const,_khr_df_primaries_e>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&parseColorPrimaries(cxxopts::ParseResult&,char_const*,ktx::Reporter&)::
                     values_abi_cxx11_,&local_228,&stack0xffffffffffffffe0,0,&local_2bd,&local_2be,
                 &local_2bf);
      lVar5 = 0x1e0;
      do {
        std::__cxx11::string::~string((string *)((long)&local_228.first._M_dataplus._M_p + lVar5));
        lVar5 = lVar5 + -0x28;
      } while (lVar5 != -0x28);
      __cxa_atexit(std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>_>_>
                   ::~unordered_map,
                   &parseColorPrimaries(cxxopts::ParseResult&,char_const*,ktx::Reporter&)::
                    values_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&parseColorPrimaries(cxxopts::ParseResult&,char_const*,ktx::Reporter&)::
                           values_abi_cxx11_);
    }
  }
  __s = local_2b8;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,local_2b8,(allocator<char> *)&local_2b0);
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_228.first);
  sVar1 = pOVar3->m_count;
  std::__cxx11::string::~string((string *)&local_228);
  if (sVar1 == 0) {
    _Var9._M_payload = (_Storage<_khr_df_primaries_e,_true>)0x0;
    _Var9._M_engaged = false;
    _Var9._5_3_ = 0;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,__s,(allocator<char> *)&local_268);
    pOVar3 = cxxopts::ParseResult::operator[](args,&local_2b0);
    pbVar4 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar3);
    std::__cxx11::string::string((string *)&local_248,(string *)pbVar4);
    to_upper_copy(&local_228.first,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,"KHR_DF_PRIMARIES_",(allocator<char> *)&local_268);
    lVar5 = std::__cxx11::string::find((string *)&local_228,(ulong)&local_2b0);
    if (lVar5 == 0) {
      std::__cxx11::string::erase
                (&local_228,local_228.first._M_dataplus._M_p,
                 local_228.first._M_dataplus._M_p + local_2b0._M_string_length);
    }
    cVar6 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&parseColorPrimaries(cxxopts::ParseResult&,char_const*,ktx::Reporter&)::
                    values_abi_cxx11_._M_h,&local_228.first);
    if (cVar6.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>,_true>
        ._M_cur == (__node_type *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_268,__s,(allocator<char> *)&local_2bc);
      pOVar3 = cxxopts::ParseResult::operator[](args,&local_268);
      pbVar4 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar3);
      Reporter::fatal_usage<char_const(&)[67],char_const*&,std::__cxx11::string_const&>
                (report,(char (*) [67])
                        "Invalid or unsupported primaries specified as --{} argument: \"{}\".",
                 &local_2b8,pbVar4);
      std::__cxx11::string::~string((string *)&local_268);
      uVar8 = 0;
      uVar7 = 0;
    }
    else {
      uVar8 = (ulong)*(uint *)((long)cVar6.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>,_true>
                                     ._M_cur + 0x28);
      uVar7 = 0x100000000;
    }
    _Var9 = (_Optional_payload_base<_khr_df_primaries_e>)(uVar8 | uVar7);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_228);
  }
  return (optional<_khr_df_primaries_e>)_Var9;
}

Assistant:

std::optional<khr_df_primaries_e> parseColorPrimaries(cxxopts::ParseResult& args, const char* argName, Reporter& report) const {
        static const std::unordered_map<std::string, khr_df_primaries_e> values{
            { "NONE", KHR_DF_PRIMARIES_UNSPECIFIED },
            { "BT709", KHR_DF_PRIMARIES_BT709 },
            { "SRGB", KHR_DF_PRIMARIES_SRGB },
            { "BT601_EBU", KHR_DF_PRIMARIES_BT601_EBU },
            { "BT601_SMPTE", KHR_DF_PRIMARIES_BT601_SMPTE },
            { "BT2020", KHR_DF_PRIMARIES_BT2020 },
            { "CIEXYZ", KHR_DF_PRIMARIES_CIEXYZ },
            { "ACES", KHR_DF_PRIMARIES_ACES },
            { "ACESCC", KHR_DF_PRIMARIES_ACESCC },
            { "NTSC1953", KHR_DF_PRIMARIES_NTSC1953 },
            { "PAL525", KHR_DF_PRIMARIES_PAL525 },
            { "DISPLAYP3", KHR_DF_PRIMARIES_DISPLAYP3 },
            { "ADOBERGB", KHR_DF_PRIMARIES_ADOBERGB },
        };

        std::optional<khr_df_primaries_e> result = {};

        if (args[argName].count()) {
            auto primariesStr = to_upper_copy(args[argName].as<std::string>());
            const std::string prefixStr = "KHR_DF_PRIMARIES_";
            if (primariesStr.find(prefixStr) == 0) {
                primariesStr.erase(primariesStr.begin(),
                                   primariesStr.begin() + prefixStr.size());
            }
            const auto it = values.find(primariesStr);
            if (it != values.end()) {
                result = it->second;
            } else {
                report.fatal_usage("Invalid or unsupported primaries specified as --{} argument: \"{}\".", argName,
                                   args[argName].as<std::string>());
            }
        }

        return result;
    }